

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  int *minor;
  long lVar1;
  mbedtls_ssl_config *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_session *pmVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uchar *puVar15;
  mbedtls_ssl_ciphersuite_t *pmVar16;
  time_t tVar17;
  int *piVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  uchar *puVar24;
  ushort *puVar25;
  int major_ver;
  undefined4 uVar26;
  int local_38;
  int local_34;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x4f3,"=> parse server hello");
  puVar24 = ssl->in_msg;
  iVar12 = mbedtls_ssl_read_record(ssl);
  if (iVar12 != 0) {
    pcVar23 = "mbedtls_ssl_read_record";
    iVar14 = 0x4f9;
    goto LAB_0016672f;
  }
  if (ssl->in_msgtype != 0x16) {
    if (ssl->renego_status == 1) {
      iVar12 = ssl->renego_records_seen;
      ssl->renego_records_seen = iVar12 + 1;
      iVar14 = ssl->conf->renego_max_records;
      if (iVar12 < iVar14 || iVar14 < 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x50c,"non-handshake message during renego");
        return -0x6b00;
      }
      pcVar23 = "renegotiation requested, but not honored by server";
      iVar12 = 0x508;
    }
    else {
      pcVar23 = "bad server hello message";
      iVar12 = 0x511;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar12,pcVar23);
    return -0x7700;
  }
  if ((ssl->conf->field_0x164 & 2) == 0) {
LAB_00166932:
    uVar19 = (ulong)((ssl->conf->field_0x164 & 2) >> 1) * 8;
    if ((ssl->in_hslen < uVar19 + 0x2a) || (*puVar24 != '\x02')) {
      iVar12 = 0x52b;
    }
    else {
      puVar24 = puVar24 + (uVar19 | 4);
      uVar26 = 0;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x53c,"server hello, version",puVar24,2);
      minor = &ssl->minor_ver;
      mbedtls_ssl_read_version
                (&ssl->major_ver,minor,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,puVar24);
      iVar12 = ssl->major_ver;
      pmVar2 = ssl->conf;
      if (((iVar12 < (int)(uint)pmVar2->min_major_ver) ||
          (*minor < (int)(uint)pmVar2->min_minor_ver)) ||
         (((int)(uint)pmVar2->max_major_ver < iVar12 || ((int)(uint)pmVar2->max_minor_ver < *minor))
         )) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x549,
                   "server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                   (ulong)pmVar2->min_major_ver,CONCAT44(uVar26,(uint)pmVar2->min_minor_ver),iVar12,
                   ssl->minor_ver,(uint)pmVar2->max_major_ver,(uint)pmVar2->max_minor_ver);
        goto LAB_00166a3c;
      }
      uVar13 = *(uint *)(puVar24 + 2);
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x556,"server hello, current time: %lu",
                 (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                        uVar13 << 0x18));
      pmVar3 = ssl->handshake;
      uVar5 = *(undefined8 *)(puVar24 + 2);
      uVar6 = *(undefined8 *)(puVar24 + 10);
      uVar7 = *(undefined8 *)(puVar24 + 0x1a);
      *(undefined8 *)(pmVar3->randbytes + 0x30) = *(undefined8 *)(puVar24 + 0x12);
      *(undefined8 *)(pmVar3->randbytes + 0x38) = uVar7;
      *(undefined8 *)(pmVar3->randbytes + 0x20) = uVar5;
      *(undefined8 *)(pmVar3->randbytes + 0x28) = uVar6;
      bVar20 = puVar24[0x22];
      uVar19 = (ulong)bVar20;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x55d,"server hello, random bytes",puVar24 + 2,0x20);
      if (uVar19 < 0x21) {
        uVar22 = ssl->in_hslen;
        uVar21 = (ulong)((ssl->conf->field_0x164 & 2) >> 1);
        lVar1 = uVar21 * 8 + 4;
        if (uVar21 * 8 + 0x2b + uVar19 < uVar22) {
          uVar21 = (ulong)(ushort)(*(ushort *)(puVar24 + uVar19 + 0x26) << 8 |
                                  *(ushort *)(puVar24 + uVar19 + 0x26) >> 8);
          if ((uVar21 - 1 < 3) || (uVar22 != lVar1 + uVar19 + uVar21 + 0x28)) {
            iVar12 = 0x56d;
          }
          else {
LAB_00166cc3:
            if (puVar24[uVar19 + 0x25] != '\0') {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x592,"server hello, bad compression: %d");
              return -0x7080;
            }
            uVar13 = (uint)(ushort)(*(ushort *)(puVar24 + uVar19 + 0x23) << 8 |
                                   *(ushort *)(puVar24 + uVar19 + 0x23) >> 8);
            pmVar16 = mbedtls_ssl_ciphersuite_from_id(uVar13);
            ssl->transform_negotiate->ciphersuite_info = pmVar16;
            if (pmVar16 == (mbedtls_ssl_ciphersuite_t *)0x0) {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x59d,"ciphersuite info for %04x not found",uVar13);
              return -0x7100;
            }
            mbedtls_ssl_optimize_checksum(ssl,pmVar16);
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5a3,"server hello, session id len.: %d",uVar19);
            puVar15 = puVar24 + 0x23;
            mbedtls_debug_print_buf
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5a4,"server hello, session id",puVar15,uVar19);
            pmVar3 = ssl->handshake;
            if (((((pmVar3->resume == 0) || (bVar20 == 0)) || (ssl->renego_status != 0)) ||
                ((pmVar4 = ssl->session_negotiate, pmVar4->ciphersuite != uVar13 ||
                 (pmVar4->compression != 0)))) ||
               ((pmVar4->id_len != uVar19 || (iVar12 = bcmp(pmVar4->id,puVar15,uVar19), iVar12 != 0)
                ))) {
              ssl->state = ssl->state + 1;
              pmVar3->resume = 0;
              tVar17 = time((time_t *)0x0);
              pmVar4 = ssl->session_negotiate;
              pmVar4->start = tVar17;
              pmVar4->ciphersuite = uVar13;
              pmVar4->compression = 0;
              pmVar4->id_len = uVar19;
              memcpy(pmVar4->id,puVar15,uVar19);
            }
            else {
              ssl->state = 0xc;
              iVar12 = mbedtls_ssl_derive_keys(ssl);
              if (iVar12 != 0) {
                pcVar23 = "mbedtls_ssl_derive_keys";
                iVar14 = 0x5c2;
LAB_0016672f:
                mbedtls_debug_print_ret
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,iVar14,pcVar23,iVar12);
                return iVar12;
              }
            }
            pcVar23 = "a";
            if (ssl->handshake->resume == 0) {
              pcVar23 = "no";
            }
            iVar12 = 0x183364;
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5c8,"%s session has been resumed",pcVar23);
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5ca,"server hello, chosen ciphersuite: %d",uVar13);
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x5cb,"server hello, compress alg.: %d",(ulong)puVar24[uVar19 + 0x25]);
            pmVar16 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
            if ((pmVar16 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
               (((ssl->conf->field_0x164 & 0x40) == 0 ||
                (pmVar16->cipher != MBEDTLS_CIPHER_ARC4_128)))) {
              piVar18 = ssl->conf->ciphersuite_list[*minor];
              do {
                iVar14 = *piVar18;
                if (iVar14 == 0) {
                  iVar12 = 0x5de;
                  goto LAB_00166a73;
                }
                piVar18 = piVar18 + 1;
              } while (iVar14 != ssl->session_negotiate->ciphersuite);
              ssl->session_negotiate->compression = 0;
              puVar25 = (ushort *)(puVar24 + uVar19 + 0x28);
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x5f6,"server hello, total extension length: %d",uVar21);
              bVar9 = false;
              while (uVar21 != 0) {
                uVar10 = puVar25[1] << 8 | puVar25[1] >> 8;
                uVar22 = (ulong)(uVar10 + 4);
                iVar14 = 0x601;
                uVar19 = uVar21 - uVar22;
                if (uVar21 < uVar22) {
LAB_00166fab:
                  bVar8 = false;
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,iVar14,"bad server hello message");
                  uVar19 = uVar21;
                  iVar12 = -0x7980;
                }
                else {
                  uVar11 = *puVar25 << 8 | *puVar25 >> 8;
                  if (uVar11 < 0x16) {
                    if (uVar11 < 0xb) {
                      if (uVar11 != 1) {
                        if (uVar11 == 4) {
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                     ,0x622,"found truncated_hmac extension");
                          bVar20 = uVar10 == 0 & (byte)ssl->conf->field_0x165 >> 7;
                          iVar14 = -0x7980;
                          if (bVar20 == 1) {
                            ssl->session_negotiate->trunc_hmac = 1;
                            goto LAB_001672ee;
                          }
                          goto LAB_001672f0;
                        }
LAB_00167303:
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                   ,0x66d,"unknown extension found: %d (ignoring)");
                        goto LAB_00167325;
                      }
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                 ,0x615,"found max_fragment_length extension");
                      iVar14 = -0x7980;
                      if (((uVar10 == 1) &&
                          (uVar13 = *(uint *)&ssl->conf->field_0x164 >> 7 & 7, uVar13 != 0)) &&
                         (iVar14 = -0x7980, uVar13 == (byte)puVar25[2])) {
                        iVar14 = 0;
                      }
                    }
                    else if (uVar11 == 0xb) {
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                 ,0x656,"found supported_point_formats extension");
                      iVar14 = ssl_parse_supported_point_formats_ext
                                         (ssl,(uchar *)(puVar25 + 2),(ulong)uVar10);
                    }
                    else {
                      if (uVar11 != 0x10) goto LAB_00167303;
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                 ,0x663,"found alpn extension");
                      iVar14 = ssl_parse_alpn_ext(ssl,(uchar *)(puVar25 + 2),(ulong)uVar10);
                    }
joined_r0x0016729e:
                    if (iVar14 == 0) {
LAB_00167325:
                      puVar25 = (ushort *)((long)puVar25 + uVar22);
                      bVar8 = true;
                      iVar14 = 0x675;
                      uVar21 = uVar19;
                      if (uVar19 - 1 < 3) goto LAB_00166fab;
                      goto LAB_0016734a;
                    }
                  }
                  else {
                    uVar13 = (uint)uVar10;
                    if (uVar11 < 0x23) {
                      if (uVar11 == 0x16) {
                        bVar8 = false;
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                   ,0x62f,"found encrypt_then_mac extension");
                        iVar14 = -0x7980;
                        if ((((ssl->conf->field_0x165 & 4) != 0) && (bVar8 = false, uVar13 == 0)) &&
                           (*minor != 0)) {
                          ssl->session_negotiate->encrypt_then_mac = 1;
LAB_00167250:
                          iVar14 = 0;
                          bVar8 = true;
                        }
                      }
                      else {
                        if (uVar11 != 0x17) goto LAB_00167303;
                        bVar8 = false;
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                   ,0x63c,"found extended_master_secret extension");
                        iVar14 = -0x7980;
                        if ((((ssl->conf->field_0x165 & 8) != 0) && (bVar8 = false, uVar13 == 0)) &&
                           (*minor != 0)) {
                          ssl->handshake->extended_ms = 1;
                          goto LAB_00167250;
                        }
                      }
                      if (bVar8) goto LAB_00167325;
                    }
                    else {
                      if (uVar11 != 0x23) {
                        if (uVar11 == 0xff01) {
                          mbedtls_debug_print_msg
                                    (ssl,3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                     ,0x608,"found renegotiation extension");
                          iVar14 = ssl_parse_renegotiation_info
                                             (ssl,(uchar *)(puVar25 + 2),(ulong)uVar13);
                          bVar9 = true;
                          goto joined_r0x0016729e;
                        }
                        goto LAB_00167303;
                      }
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                                 ,0x649,"found session_ticket extension");
                      bVar20 = uVar13 == 0 & ssl->conf->field_0x166;
                      iVar14 = -0x7980;
                      if (bVar20 == 1) {
                        ssl->handshake->new_session_ticket = 1;
LAB_001672ee:
                        iVar14 = 0;
                      }
LAB_001672f0:
                      if (bVar20 != 0) goto LAB_00167325;
                    }
                  }
                  bVar8 = false;
                  uVar19 = uVar21;
                  iVar12 = iVar14;
                }
LAB_0016734a:
                uVar21 = uVar19;
                if (!bVar8) {
                  return iVar12;
                }
              }
              iVar12 = ssl->secure_renegotiation;
              if ((iVar12 == 0) && ((*(uint *)&ssl->conf->field_0x164 & 0x30) == 0x20)) {
                pcVar23 = "legacy renegotiation, breaking off handshake";
                iVar12 = 0x680;
                goto LAB_0016749e;
              }
              if (ssl->renego_status == 1) {
                if (iVar12 == 1 && !bVar9) {
                  pcVar23 = "renegotiation_info extension missing (secure)";
                  iVar12 = 0x688;
LAB_0016749e:
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                             ,iVar12,pcVar23);
                  iVar12 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                  if (iVar12 == 0) {
                    return -0x7980;
                  }
                  return iVar12;
                }
                if ((iVar12 == 0) && ((ssl->conf->field_0x164 & 0x30) == 0)) {
                  pcVar23 = "legacy renegotiation not allowed";
                  iVar12 = 0x68f;
                  goto LAB_0016749e;
                }
                if (iVar12 == 0 && bVar9) {
                  pcVar23 = "renegotiation_info extension present (legacy)";
                  iVar12 = 0x696;
                  goto LAB_0016749e;
                }
              }
              pcVar23 = "<= parse server hello";
              iVar12 = 0x6a3;
LAB_00166b5f:
              mbedtls_debug_print_msg
                        (ssl,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,iVar12,pcVar23);
              return 0;
            }
            iVar12 = 0x5d5;
          }
        }
        else {
          if (uVar22 == lVar1 + uVar19 + 0x26) {
            uVar21 = 0;
            goto LAB_00166cc3;
          }
          iVar12 = 0x577;
        }
      }
      else {
        iVar12 = 0x561;
      }
    }
LAB_00166a73:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,iVar12,"bad server hello message");
    iVar12 = -0x7980;
  }
  else {
    if (*puVar24 != '\x03') {
      free(ssl->handshake->verify_cookie);
      pmVar3 = ssl->handshake;
      pmVar3->verify_cookie = (uchar *)0x0;
      pmVar3->verify_cookie_len = '\0';
      goto LAB_00166932;
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x51a,"received hello verify request");
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x51b,"<= parse server hello");
    puVar24 = ssl->in_msg;
    uVar13 = *(uint *)&ssl->conf->field_0x164 & 2;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4a8,"=> parse hello verify request");
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4b0,"server version",puVar24 + (ulong)uVar13 * 4 + 4,2);
    mbedtls_ssl_read_version
              (&local_34,&local_38,*(uint *)&ssl->conf->field_0x164 >> 1 & 1,
               puVar24 + (ulong)uVar13 * 4 + 4);
    if (((1 < local_38 && 2 < local_34) && (local_34 <= (int)(uint)ssl->conf->max_major_ver)) &&
       (local_38 <= (int)(uint)ssl->conf->max_minor_ver)) {
      bVar20 = puVar24[(ulong)uVar13 * 4 + 6];
      uVar19 = (ulong)bVar20;
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x4c6,"cookie",puVar24 + (ulong)uVar13 * 4 + 7,uVar19);
      free(ssl->handshake->verify_cookie);
      puVar15 = (uchar *)calloc(1,uVar19);
      pmVar3 = ssl->handshake;
      pmVar3->verify_cookie = puVar15;
      if (puVar15 == (uchar *)0x0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x4cd,"alloc failed (%d bytes)",uVar19);
        return -0x7f00;
      }
      memcpy(puVar15,puVar24 + (ulong)uVar13 * 4 + 7,uVar19);
      pmVar3->verify_cookie_len = bVar20;
      ssl->state = 1;
      mbedtls_ssl_reset_checksum(ssl);
      mbedtls_ssl_recv_flight_completed(ssl);
      pcVar23 = "<= parse hello verify request";
      iVar12 = 0x4da;
      goto LAB_00166b5f;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x4bd,"bad server version");
LAB_00166a3c:
    mbedtls_ssl_send_alert_message(ssl,'\x02','F');
    iVar12 = -0x6e80;
  }
  return iVar12;
}

Assistant:

static int ssl_parse_server_hello( mbedtls_ssl_context *ssl )
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_ZLIB_SUPPORT)
    int accept_comp;
#endif
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;
#if defined(MBEDTLS_DEBUG_C)
    uint32_t t;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello" ) );

    buf = ssl->in_msg;

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
        {
            ssl->renego_records_seen++;

            if( ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                    "but not honored by server" ) );
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-handshake message during renego" ) );
            return( MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO );
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "received hello verify request" ) );
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello" ) );
            return( ssl_parse_hello_verify_request( ssl ) );
        }
        else
        {
            /* We made it through the verification process */
            mbedtls_free( ssl->handshake->verify_cookie );
            ssl->handshake->verify_cookie = NULL;
            ssl->handshake->verify_cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if( ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len( ssl ) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len( ssl );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, version", buf + 0, 2 );
    mbedtls_ssl_read_version( &ssl->major_ver, &ssl->minor_ver,
                      ssl->conf->transport, buf + 0 );

    if( ssl->major_ver < ssl->conf->min_major_ver ||
        ssl->minor_ver < ssl->conf->min_minor_ver ||
        ssl->major_ver > ssl->conf->max_major_ver ||
        ssl->minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server version out of bounds - "
                            " min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                            ssl->conf->min_major_ver, ssl->conf->min_minor_ver,
                            ssl->major_ver, ssl->minor_ver,
                            ssl->conf->max_major_ver, ssl->conf->max_minor_ver ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

#if defined(MBEDTLS_DEBUG_C)
    t = ( (uint32_t) buf[2] << 24 )
      | ( (uint32_t) buf[3] << 16 )
      | ( (uint32_t) buf[4] <<  8 )
      | ( (uint32_t) buf[5]       );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#endif

    memcpy( ssl->handshake->randbytes + 32, buf + 2, 32 );

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, random bytes", buf + 2, 32 );

    if( n > 32 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    if( ssl->in_hslen > mbedtls_ssl_hs_hdr_len( ssl ) + 39 + n )
    {
        ext_len = ( ( buf[38 + n] <<  8 )
                  | ( buf[39 + n]       ) );

        if( ( ext_len > 0 && ext_len < 4 ) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 40 + n + ext_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else if( ssl->in_hslen == mbedtls_ssl_hs_hdr_len( ssl ) + 38 + n )
    {
        ext_len = 0;
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* ciphersuite (used later) */
    i = ( buf[35 + n] << 8 ) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

#if defined(MBEDTLS_ZLIB_SUPPORT)
    /* See comments in ssl_write_client_hello() */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        accept_comp = 0;
    else
#endif
        accept_comp = 1;

    if( comp != MBEDTLS_SSL_COMPRESS_NULL &&
        ( comp != MBEDTLS_SSL_COMPRESS_DEFLATE || accept_comp == 0 ) )
#else /* MBEDTLS_ZLIB_SUPPORT */
    if( comp != MBEDTLS_SSL_COMPRESS_NULL )
#endif/* MBEDTLS_ZLIB_SUPPORT */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server hello, bad compression: %d", comp ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * Initialize update checksum functions
     */
    ssl->transform_negotiate->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id( i );

    if( ssl->transform_negotiate->ciphersuite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ciphersuite info for %04x not found", i ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    mbedtls_ssl_optimize_checksum( ssl, ssl->transform_negotiate->ciphersuite_info );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 35, n );

    /*
     * Check if the session can be resumed
     */
    if( ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->compression != comp ||
        ssl->session_negotiate->id_len != n ||
        memcmp( ssl->session_negotiate->id, buf + 35, n ) != 0 )
    {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = time( NULL );
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->compression = comp;
        ssl->session_negotiate->id_len = n;
        memcpy( ssl->session_negotiate->id, buf + 35, n );
    }